

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_avx2.c
# Opt level: O2

uint sad32xh_avx2(uint8_t *src_ptr,int src_stride,uint8_t *ref_ptr,int ref_stride,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  uint uVar3;
  bool bVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [64];
  undefined1 auVar7 [32];
  
  uVar3 = (uint)h >> 1;
  auVar6 = ZEXT1664((undefined1  [16])0x0);
  while( true ) {
    bVar4 = uVar3 == 0;
    uVar3 = uVar3 - 1;
    auVar5 = auVar6._0_32_;
    if (bVar4) break;
    auVar7 = vpsadbw_avx2(*(undefined1 (*) [32])ref_ptr,*(undefined1 (*) [32])src_ptr);
    auVar2 = vpsadbw_avx2(*(undefined1 (*) [32])(*(undefined1 (*) [32])ref_ptr + ref_stride),
                          *(undefined1 (*) [32])(*(undefined1 (*) [32])src_ptr + src_stride));
    auVar5 = vpaddd_avx2(auVar7,auVar5);
    auVar5 = vpaddd_avx2(auVar5,auVar2);
    auVar6 = ZEXT3264(auVar5);
    ref_ptr = *(undefined1 (*) [32])ref_ptr + ref_stride * 2;
    src_ptr = *(undefined1 (*) [32])src_ptr + src_stride * 2;
  }
  auVar7 = vpsrldq_avx2(auVar5,8);
  auVar5 = vpaddd_avx2(auVar7,auVar5);
  auVar1 = vpaddd_avx(auVar5._0_16_,auVar5._16_16_);
  return auVar1._0_4_;
}

Assistant:

static inline unsigned int sad32xh_avx2(const uint8_t *src_ptr, int src_stride,
                                        const uint8_t *ref_ptr, int ref_stride,
                                        int h) {
  int i;
  __m256i sad1_reg, sad2_reg, ref1_reg, ref2_reg;
  __m256i sum_sad = _mm256_setzero_si256();
  __m256i sum_sad_h;
  __m128i sum_sad128;
  int ref2_stride = ref_stride << 1;
  int src2_stride = src_stride << 1;
  int max = h >> 1;
  for (i = 0; i < max; i++) {
    ref1_reg = _mm256_loadu_si256((__m256i const *)ref_ptr);
    ref2_reg = _mm256_loadu_si256((__m256i const *)(ref_ptr + ref_stride));
    sad1_reg =
        _mm256_sad_epu8(ref1_reg, _mm256_loadu_si256((__m256i const *)src_ptr));
    sad2_reg = _mm256_sad_epu8(
        ref2_reg, _mm256_loadu_si256((__m256i const *)(src_ptr + src_stride)));
    sum_sad = _mm256_add_epi32(sum_sad, _mm256_add_epi32(sad1_reg, sad2_reg));
    ref_ptr += ref2_stride;
    src_ptr += src2_stride;
  }
  sum_sad_h = _mm256_srli_si256(sum_sad, 8);
  sum_sad = _mm256_add_epi32(sum_sad, sum_sad_h);
  sum_sad128 = _mm256_extracti128_si256(sum_sad, 1);
  sum_sad128 = _mm_add_epi32(_mm256_castsi256_si128(sum_sad), sum_sad128);
  unsigned int res = (unsigned int)_mm_cvtsi128_si32(sum_sad128);
  _mm256_zeroupper();
  return res;
}